

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O1

int __thiscall CSIZECommand::doWhat(CSIZECommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  long lVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string ret;
  char buffer [4096];
  string local_1038;
  string local_1018 [128];
  
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 3) {
    paVar5 = &local_1018[0].field_2;
    local_1018[0]._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1018,"530 Please login with USER and PASS.\r\n","");
    CClient::sendMsg(pClient,local_1018);
    _Var4._M_p = local_1018[0]._M_dataplus._M_p;
  }
  else {
    bzero(local_1018,0x1000);
    lVar2 = GetFileSize(this,pClient);
    if (-1 < lVar2) {
      sprintf((char *)local_1018,"213 %ld\r\n",lVar2);
      local_1038._M_dataplus._M_p = (pointer)&local_1038.field_2;
      sVar3 = strlen((char *)local_1018);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1038,local_1018,(long)&local_1018[0]._M_dataplus._M_p + sVar3);
      CClient::sendMsg(pClient,&local_1038);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038._M_dataplus._M_p != &local_1038.field_2) {
        operator_delete(local_1038._M_dataplus._M_p);
      }
      return 1;
    }
    paVar5 = &local_1038.field_2;
    local_1038._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1038,"550 Could not get file size.\r\n","");
    CClient::sendMsg(pClient,&local_1038);
    _Var4._M_p = local_1038._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar5) {
    operator_delete(_Var4._M_p);
  }
  return -1;
}

Assistant:

int CSIZECommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        char buffer[BUFFER_SIZE];
        bzero(buffer,BUFFER_SIZE);
        long size = GetFileSize(pClient);
        if(size >= 0){
            sprintf(buffer,"213 %ld\r\n",size);
            string ret(buffer);
            pClient->sendMsg(ret);
            return 1;
        }
        else{
            string ret = "550 Could not get file size.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}